

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O2

int CONF_parse_list(char *list,int sep,int nospc,list_cb *list_cb,void *arg)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  byte *pbVar5;
  
  if (list == (char *)0x0) {
    iVar2 = 0;
    ERR_put_error(0xd,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                  ,0x248);
  }
  else {
    do {
      if (nospc != 0) {
        while ((*list != 0 && (iVar2 = OPENSSL_isspace((uint)(byte)*list), iVar2 != 0))) {
          list = (char *)((byte *)list + 1);
        }
      }
      pbVar3 = (byte *)strchr(list,(int)(char)sep);
      if ((pbVar3 == (byte *)list) || (*list == 0)) {
        iVar2 = (*list_cb)((char *)0x0,0,arg);
      }
      else {
        pbVar5 = pbVar3;
        if (pbVar3 == (byte *)0x0) {
          sVar4 = strlen(list);
          pbVar5 = (byte *)list + sVar4;
        }
        if (nospc == 0) {
          pbVar5 = pbVar5 + -1;
        }
        else {
          do {
            pbVar1 = pbVar5 + -1;
            pbVar5 = pbVar5 + -1;
            iVar2 = OPENSSL_isspace((uint)*pbVar1);
          } while (iVar2 != 0);
        }
        iVar2 = (*list_cb)(list,((int)pbVar5 - (int)list) + 1,arg);
      }
      if (iVar2 < 1) {
        return iVar2;
      }
      list = (char *)(pbVar3 + 1);
    } while (pbVar3 != (byte *)0x0);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CONF_parse_list(const char *list, char sep, int remove_whitespace,
                    int (*list_cb)(const char *elem, size_t len, void *usr),
                    void *arg) {
  int ret;
  const char *lstart, *tmpend, *p;

  if (list == NULL) {
    OPENSSL_PUT_ERROR(CONF, CONF_R_LIST_CANNOT_BE_NULL);
    return 0;
  }

  lstart = list;
  for (;;) {
    if (remove_whitespace) {
      while (*lstart && OPENSSL_isspace((unsigned char)*lstart)) {
        lstart++;
      }
    }
    p = strchr(lstart, sep);
    if (p == lstart || !*lstart) {
      ret = list_cb(NULL, 0, arg);
    } else {
      if (p) {
        tmpend = p - 1;
      } else {
        tmpend = lstart + strlen(lstart) - 1;
      }
      if (remove_whitespace) {
        while (OPENSSL_isspace((unsigned char)*tmpend)) {
          tmpend--;
        }
      }
      ret = list_cb(lstart, tmpend - lstart + 1, arg);
    }
    if (ret <= 0) {
      return ret;
    }
    if (p == NULL) {
      return 1;
    }
    lstart = p + 1;
  }
}